

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::olc_ConfigureSystem(PixelGameEngine *this)

{
  unique_ptr<olc::Renderer_OGL10,_std::default_delete<olc::Renderer_OGL10>_> local_28;
  unique_ptr<olc::Platform_Linux,_std::default_delete<olc::Platform_Linux>_> local_20;
  unique_ptr<olc::ImageLoader_LibPNG,_std::default_delete<olc::ImageLoader_LibPNG>_> local_18;
  PixelGameEngine *local_10;
  PixelGameEngine *this_local;
  
  local_10 = this;
  std::make_unique<olc::ImageLoader_LibPNG>();
  std::unique_ptr<olc::ImageLoader,std::default_delete<olc::ImageLoader>>::operator=
            ((unique_ptr<olc::ImageLoader,std::default_delete<olc::ImageLoader>> *)&Sprite::loader,
             &local_18);
  std::unique_ptr<olc::ImageLoader_LibPNG,_std::default_delete<olc::ImageLoader_LibPNG>_>::
  ~unique_ptr(&local_18);
  std::make_unique<olc::Platform_Linux>();
  std::unique_ptr<olc::Platform,std::default_delete<olc::Platform>>::operator=
            ((unique_ptr<olc::Platform,std::default_delete<olc::Platform>> *)&platform,&local_20);
  std::unique_ptr<olc::Platform_Linux,_std::default_delete<olc::Platform_Linux>_>::~unique_ptr
            (&local_20);
  std::make_unique<olc::Renderer_OGL10>();
  std::unique_ptr<olc::Renderer,std::default_delete<olc::Renderer>>::operator=
            ((unique_ptr<olc::Renderer,std::default_delete<olc::Renderer>> *)&renderer,&local_28);
  std::unique_ptr<olc::Renderer_OGL10,_std::default_delete<olc::Renderer_OGL10>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
            ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)&platform);
  Platform::ptrPGE = this;
  std::unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_>::operator->
            ((unique_ptr<olc::Renderer,_std::default_delete<olc::Renderer>_> *)&renderer);
  Renderer::ptrPGE = this;
  return;
}

Assistant:

void PixelGameEngine::olc_ConfigureSystem()
	{

#if defined(OLC_IMAGE_GDI)
		olc::Sprite::loader = std::make_unique<olc::ImageLoader_GDIPlus>();
#endif

#if defined(OLC_IMAGE_LIBPNG)
		olc::Sprite::loader = std::make_unique<olc::ImageLoader_LibPNG>();
#endif

#if defined(OLC_IMAGE_STB)
		olc::Sprite::loader = std::make_unique<olc::ImageLoader_STB>();
#endif

#if defined(OLC_IMAGE_CUSTOM_EX)
		olc::Sprite::loader = std::make_unique<OLC_IMAGE_CUSTOM_EX>();
#endif




#if defined(OLC_PLATFORM_WINAPI)
		platform = std::make_unique<olc::Platform_Windows>();
#endif

#if defined(OLC_PLATFORM_X11)
		platform = std::make_unique<olc::Platform_Linux>();
#endif

#if defined(OLC_PLATFORM_GLUT)
		platform = std::make_unique<olc::Platform_GLUT>();
#endif

#if defined(OLC_PLATFORM_EMSCRIPTEN)
		platform = std::make_unique<olc::Platform_Emscripten>();
#endif

#if defined(OLC_PLATFORM_CUSTOM_EX)
		platform = std::make_unique<OLC_PLATFORM_CUSTOM_EX>();
#endif



#if defined(OLC_GFX_OPENGL10)
		renderer = std::make_unique<olc::Renderer_OGL10>();
#endif

#if defined(OLC_GFX_OPENGL33)
		renderer = std::make_unique<olc::Renderer_OGL33>();
#endif

#if defined(OLC_GFX_OPENGLES2)
		renderer = std::make_unique<olc::Renderer_OGLES2>();
#endif

#if defined(OLC_GFX_DIRECTX10)
		renderer = std::make_unique<olc::Renderer_DX10>();
#endif

#if defined(OLC_GFX_DIRECTX11)
		renderer = std::make_unique<olc::Renderer_DX11>();
#endif

#if defined(OLC_GFX_CUSTOM_EX)
		renderer = std::make_unique<OLC_RENDERER_CUSTOM_EX>();
#endif

		// Associate components with PGE instance
		platform->ptrPGE = this;
		renderer->ptrPGE = this;
	}